

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TMS320C64xMapping.c
# Opt level: O1

char * TMS320C64x_insn_name(csh handle,uint id)

{
  if (0x90 < id) {
    return (char *)0x0;
  }
  return insn_name_maps[id].name;
}

Assistant:

const char *TMS320C64x_insn_name(csh handle, unsigned int id)
{
#ifndef CAPSTONE_DIET
	if (id >= TMS320C64X_INS_ENDING)
		return NULL;

	return insn_name_maps[id].name;
#else
	return NULL;
#endif
}